

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void statement(LexState *ls)

{
  int iVar1;
  int iVar2;
  TString *label;
  int line;
  LexState *ls_local;
  
  iVar2 = ls->linenumber;
  enterlevel(ls);
  iVar1 = (ls->t).token;
  if (iVar1 == 0x3b) {
    luaX_next(ls);
    goto LAB_0011570b;
  }
  if (iVar1 != 0x102) {
    if (iVar1 == 0x103) {
      luaX_next(ls);
      block(ls);
      check_match(ls,0x106,0x103,iVar2);
      goto LAB_0011570b;
    }
    if (iVar1 == 0x108) {
      forstat(ls,iVar2);
      goto LAB_0011570b;
    }
    if (iVar1 == 0x109) {
      funcstat(ls,iVar2);
      goto LAB_0011570b;
    }
    if (iVar1 != 0x10a) {
      if (iVar1 == 0x10b) {
        ifstat(ls,iVar2);
      }
      else if (iVar1 == 0x10d) {
        luaX_next(ls);
        iVar2 = testnext(ls,0x109);
        if (iVar2 == 0) {
          localstat(ls);
        }
        else {
          localfunc(ls);
        }
      }
      else if (iVar1 == 0x111) {
        repeatstat(ls,iVar2);
      }
      else if (iVar1 == 0x112) {
        luaX_next(ls);
        retstat(ls);
      }
      else if (iVar1 == 0x116) {
        whilestat(ls,iVar2);
      }
      else if (iVar1 == 0x120) {
        luaX_next(ls);
        label = str_checkname(ls);
        labelstat(ls,label,iVar2);
      }
      else {
        exprstat(ls);
      }
      goto LAB_0011570b;
    }
  }
  iVar2 = luaK_jump(ls->fs);
  gotostat(ls,iVar2);
LAB_0011570b:
  ls->fs->freereg = ls->fs->nactvar;
  ls->L->nCcalls = ls->L->nCcalls - 1;
  return;
}

Assistant:

static void statement (LexState *ls) {
  int line = ls->linenumber;  /* may be needed for error messages */
  enterlevel(ls);
  switch (ls->t.token) {
    case ';': {  /* stat -> ';' (empty statement) */
      luaX_next(ls);  /* skip ';' */
      break;
    }
    case TK_IF: {  /* stat -> ifstat */
      ifstat(ls, line);
      break;
    }
    case TK_WHILE: {  /* stat -> whilestat */
      whilestat(ls, line);
      break;
    }
    case TK_DO: {  /* stat -> DO block END */
      luaX_next(ls);  /* skip DO */
      block(ls);
      check_match(ls, TK_END, TK_DO, line);
      break;
    }
    case TK_FOR: {  /* stat -> forstat */
      forstat(ls, line);
      break;
    }
    case TK_REPEAT: {  /* stat -> repeatstat */
      repeatstat(ls, line);
      break;
    }
    case TK_FUNCTION: {  /* stat -> funcstat */
      funcstat(ls, line);
      break;
    }
    case TK_LOCAL: {  /* stat -> localstat */
      luaX_next(ls);  /* skip LOCAL */
      if (testnext(ls, TK_FUNCTION))  /* local function? */
        localfunc(ls);
      else
        localstat(ls);
      break;
    }
    case TK_DBCOLON: {  /* stat -> label */
      luaX_next(ls);  /* skip double colon */
      labelstat(ls, str_checkname(ls), line);
      break;
    }
    case TK_RETURN: {  /* stat -> retstat */
      luaX_next(ls);  /* skip RETURN */
      retstat(ls);
      break;
    }
    case TK_BREAK:   /* stat -> breakstat */
    case TK_GOTO: {  /* stat -> 'goto' NAME */
      gotostat(ls, luaK_jump(ls->fs));
      break;
    }
    default: {  /* stat -> func | assignment */
      exprstat(ls);
      break;
    }
  }
  lua_assert(ls->fs->f->maxstacksize >= ls->fs->freereg &&
             ls->fs->freereg >= ls->fs->nactvar);
  ls->fs->freereg = ls->fs->nactvar;  /* free registers */
  leavelevel(ls);
}